

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void ClosePendingUpvalues(ExpressionContext *ctx,FunctionData *function)

{
  ExprSequence *pEVar1;
  ExprBase **ppEVar2;
  VariableData *pVVar3;
  uint uVar4;
  ScopeData *curr;
  SynBase *pSVar5;
  ExprBase *pEVar6;
  ScopeData *pSVar7;
  FunctionData *pFVar8;
  IntrusiveList<CloseUpvaluesData> *pIVar9;
  VariableHandle *pVVar10;
  ulong uVar11;
  CloseUpvaluesData *pCVar12;
  
  for (pSVar7 = ctx->scope; (pSVar7 != (ScopeData *)0x0 && (pSVar7->ownerType == (TypeBase *)0x0));
      pSVar7 = pSVar7->scope) {
    pFVar8 = pSVar7->ownerFunction;
    if (pFVar8 != (FunctionData *)0x0) goto LAB_00164ff9;
  }
  pFVar8 = (FunctionData *)0x0;
LAB_00164ff9:
  if (pFVar8 != function) {
    __assert_fail("function == ctx.GetCurrentFunction(ctx.scope)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0xb2b,"void ClosePendingUpvalues(ExpressionContext &, FunctionData *)");
  }
  pIVar9 = &function->closeUpvalues;
  if (function == (FunctionData *)0x0) {
    pIVar9 = &ctx->globalCloseUpvalues;
  }
  pCVar12 = pIVar9->head;
  do {
    if (pCVar12 == (CloseUpvaluesData *)0x0) {
      return;
    }
    switch(pCVar12->type) {
    case CLOSE_UPVALUES_FUNCTION:
      if (function == (FunctionData *)0x0) {
        __assert_fail("function",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0xb34,"void ClosePendingUpvalues(ExpressionContext &, FunctionData *)");
      }
      pSVar7 = (ScopeData *)&pCVar12->scope;
      do {
        pSVar7 = pSVar7->scope;
        if (pSVar7 == (ScopeData *)0x0) break;
        uVar4 = (pSVar7->variables).count;
        if (uVar4 != 0) {
          uVar11 = 0;
          do {
            pVVar3 = (pSVar7->variables).data[uVar11];
            if (pVVar3->usedAsExternal == true) {
              pEVar1 = pCVar12->expr;
              pSVar5 = &ExpressionContext::MakeInternal(ctx,pCVar12->source)->super_SynBase;
              pEVar6 = CreateUpvalueClose(ctx,pSVar5,pVVar3);
              uVar4 = (pEVar1->expressions).count;
              if (uVar4 == (pEVar1->expressions).max) {
                SmallArray<ExprBase_*,_4U>::grow(&pEVar1->expressions,uVar4);
              }
              ppEVar2 = (pEVar1->expressions).data;
              if (ppEVar2 == (ExprBase **)0x0) goto LAB_0016540b;
              uVar4 = (pEVar1->expressions).count;
              (pEVar1->expressions).count = uVar4 + 1;
              ppEVar2[uVar4] = pEVar6;
              uVar4 = (pSVar7->variables).count;
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 < uVar4);
        }
      } while (pSVar7->ownerFunction == (FunctionData *)0x0);
      break;
    case CLOSE_UPVALUES_BLOCK:
      pSVar7 = pCVar12->scope;
      if ((pSVar7->variables).count != 0) {
        uVar11 = 0;
        do {
          pVVar3 = (pSVar7->variables).data[uVar11];
          if (pVVar3->usedAsExternal == true) {
            pEVar1 = pCVar12->expr;
            pSVar5 = &ExpressionContext::MakeInternal(ctx,pCVar12->source)->super_SynBase;
            pEVar6 = CreateUpvalueClose(ctx,pSVar5,pVVar3);
            uVar4 = (pEVar1->expressions).count;
            if (uVar4 == (pEVar1->expressions).max) {
              SmallArray<ExprBase_*,_4U>::grow(&pEVar1->expressions,uVar4);
            }
            ppEVar2 = (pEVar1->expressions).data;
            if (ppEVar2 == (ExprBase **)0x0) goto LAB_0016540b;
            uVar4 = (pEVar1->expressions).count;
            (pEVar1->expressions).count = uVar4 + 1;
            ppEVar2[uVar4] = pEVar6;
            pSVar7 = pCVar12->scope;
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < (pSVar7->variables).count);
      }
      break;
    case CLOSE_UPVALUES_BREAK:
      for (pSVar7 = pCVar12->scope;
          (pSVar7 != (ScopeData *)0x0 &&
          (pSVar7->breakDepth != pCVar12->scope->breakDepth - pCVar12->depth));
          pSVar7 = pSVar7->scope) {
        uVar4 = (pSVar7->variables).count;
        if (uVar4 != 0) {
          uVar11 = 0;
          do {
            pVVar3 = (pSVar7->variables).data[uVar11];
            if (pVVar3->usedAsExternal == true) {
              pEVar1 = pCVar12->expr;
              pSVar5 = &ExpressionContext::MakeInternal(ctx,pCVar12->source)->super_SynBase;
              pEVar6 = CreateUpvalueClose(ctx,pSVar5,pVVar3);
              uVar4 = (pEVar1->expressions).count;
              if (uVar4 == (pEVar1->expressions).max) {
                SmallArray<ExprBase_*,_4U>::grow(&pEVar1->expressions,uVar4);
              }
              ppEVar2 = (pEVar1->expressions).data;
              if (ppEVar2 == (ExprBase **)0x0) goto LAB_0016540b;
              uVar4 = (pEVar1->expressions).count;
              (pEVar1->expressions).count = uVar4 + 1;
              ppEVar2[uVar4] = pEVar6;
              uVar4 = (pSVar7->variables).count;
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 < uVar4);
        }
      }
      break;
    case CLOSE_UPVALUES_CONTINUE:
      for (pSVar7 = pCVar12->scope;
          (pSVar7 != (ScopeData *)0x0 &&
          (pSVar7->contiueDepth != pCVar12->scope->contiueDepth - pCVar12->depth));
          pSVar7 = pSVar7->scope) {
        uVar4 = (pSVar7->variables).count;
        if (uVar4 != 0) {
          uVar11 = 0;
          do {
            pVVar3 = (pSVar7->variables).data[uVar11];
            if (pVVar3->usedAsExternal == true) {
              pEVar1 = pCVar12->expr;
              pSVar5 = &ExpressionContext::MakeInternal(ctx,pCVar12->source)->super_SynBase;
              pEVar6 = CreateUpvalueClose(ctx,pSVar5,pVVar3);
              uVar4 = (pEVar1->expressions).count;
              if (uVar4 == (pEVar1->expressions).max) {
                SmallArray<ExprBase_*,_4U>::grow(&pEVar1->expressions,uVar4);
              }
              ppEVar2 = (pEVar1->expressions).data;
              if (ppEVar2 == (ExprBase **)0x0) goto LAB_0016540b;
              uVar4 = (pEVar1->expressions).count;
              (pEVar1->expressions).count = uVar4 + 1;
              ppEVar2[uVar4] = pEVar6;
              uVar4 = (pSVar7->variables).count;
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 < uVar4);
        }
      }
      break;
    case CLOSE_UPVALUES_ARGUMENT:
      if (function == (FunctionData *)0x0) {
        __assert_fail("function",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0xb6c,"void ClosePendingUpvalues(ExpressionContext &, FunctionData *)");
      }
      for (pVVar10 = (function->argumentVariables).head; pVVar10 != (VariableHandle *)0x0;
          pVVar10 = pVVar10->next) {
        if (pVVar10->variable->usedAsExternal == true) {
          pEVar1 = pCVar12->expr;
          pSVar5 = &ExpressionContext::MakeInternal(ctx,pCVar12->source)->super_SynBase;
          pEVar6 = CreateUpvalueClose(ctx,pSVar5,pVVar10->variable);
          uVar4 = (pEVar1->expressions).count;
          if (uVar4 == (pEVar1->expressions).max) {
            SmallArray<ExprBase_*,_4U>::grow(&pEVar1->expressions,uVar4);
          }
          ppEVar2 = (pEVar1->expressions).data;
          if (ppEVar2 == (ExprBase **)0x0) goto LAB_0016540b;
          uVar4 = (pEVar1->expressions).count;
          (pEVar1->expressions).count = uVar4 + 1;
          ppEVar2[uVar4] = pEVar6;
        }
      }
      pVVar3 = function->contextArgument;
      if ((pVVar3 != (VariableData *)0x0) && (pVVar3->usedAsExternal == true)) {
        pEVar1 = pCVar12->expr;
        pSVar5 = &ExpressionContext::MakeInternal(ctx,pCVar12->source)->super_SynBase;
        pEVar6 = CreateUpvalueClose(ctx,pSVar5,pVVar3);
        uVar4 = (pEVar1->expressions).count;
        if (uVar4 == (pEVar1->expressions).max) {
          SmallArray<ExprBase_*,_4U>::grow(&pEVar1->expressions,uVar4);
        }
        ppEVar2 = (pEVar1->expressions).data;
        if (ppEVar2 == (ExprBase **)0x0) {
LAB_0016540b:
          __assert_fail("data",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x162,
                        "void SmallArray<ExprBase *, 4>::push_back(const T &) [T = ExprBase *, N = 4]"
                       );
        }
        uVar4 = (pEVar1->expressions).count;
        (pEVar1->expressions).count = uVar4 + 1;
        ppEVar2[uVar4] = pEVar6;
      }
    }
    pCVar12 = pCVar12->next;
  } while( true );
}

Assistant:

void ClosePendingUpvalues(ExpressionContext &ctx, FunctionData *function)
{
	IntrusiveList<CloseUpvaluesData> &closeUpvalues = function ? function->closeUpvalues : ctx.globalCloseUpvalues;

	assert(function == ctx.GetCurrentFunction(ctx.scope));

	for(CloseUpvaluesData *curr = closeUpvalues.head; curr; curr = curr->next)
	{
		CloseUpvaluesData &data = *curr;

		switch(data.type)
		{
		case CLOSE_UPVALUES_FUNCTION:
			assert(function);

			for(ScopeData *scope = data.scope; scope; scope = scope->scope)
			{
				for(unsigned i = 0; i < scope->variables.size(); i++)
				{
					VariableData *variable = scope->variables[i];

					if(variable->usedAsExternal)
						data.expr->expressions.push_back(CreateUpvalueClose(ctx, ctx.MakeInternal(data.source), variable));
				}

				if(scope->ownerFunction)
					break;
			}
			break;
		case CLOSE_UPVALUES_BLOCK:
			for(unsigned i = 0; i < data.scope->variables.size(); i++)
			{
				VariableData *variable = data.scope->variables[i];

				if(variable->usedAsExternal)
					data.expr->expressions.push_back(CreateUpvalueClose(ctx, ctx.MakeInternal(data.source), variable));
			}
			break;
		case CLOSE_UPVALUES_BREAK:
			for(ScopeData *scope = data.scope; scope; scope = scope->scope)
			{
				if(scope->breakDepth == data.scope->breakDepth - data.depth)
					break;

				for(unsigned i = 0; i < scope->variables.size(); i++)
				{
					VariableData *variable = scope->variables[i];

					if(variable->usedAsExternal)
						data.expr->expressions.push_back(CreateUpvalueClose(ctx, ctx.MakeInternal(data.source), variable));
				}
			}
			break;
		case CLOSE_UPVALUES_CONTINUE:
			for(ScopeData *scope = data.scope; scope; scope = scope->scope)
			{
				if(scope->contiueDepth == data.scope->contiueDepth - data.depth)
					break;

				for(unsigned i = 0; i < scope->variables.size(); i++)
				{
					VariableData *variable = scope->variables[i];

					if(variable->usedAsExternal)
						data.expr->expressions.push_back(CreateUpvalueClose(ctx, ctx.MakeInternal(data.source), variable));
				}
			}
			break;
		case CLOSE_UPVALUES_ARGUMENT:
			assert(function);

			for(VariableHandle *curr = function->argumentVariables.head; curr; curr = curr->next)
			{
				if(curr->variable->usedAsExternal)
					data.expr->expressions.push_back(CreateUpvalueClose(ctx, ctx.MakeInternal(data.source), curr->variable));
			}

			if(VariableData *variable = function->contextArgument)
			{
				if(variable->usedAsExternal)
					data.expr->expressions.push_back(CreateUpvalueClose(ctx, ctx.MakeInternal(data.source), variable));
			}
		}
	}
}